

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_impl.h
# Opt level: O3

void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash,uchar *tag,size_t taglen)

{
  uchar buf [32];
  uchar auStack_38 [32];
  
  hash->s[0] = 0x6a09e667;
  hash->s[1] = 0xbb67ae85;
  hash->s[2] = 0x3c6ef372;
  hash->s[3] = 0xa54ff53a;
  hash->s[4] = 0x510e527f;
  hash->s[5] = 0x9b05688c;
  hash->s[6] = 0x1f83d9ab;
  hash->s[7] = 0x5be0cd19;
  hash->bytes = 0;
  secp256k1_sha256_write(hash,tag,taglen);
  secp256k1_sha256_finalize(hash,auStack_38);
  hash->s[0] = 0x6a09e667;
  hash->s[1] = 0xbb67ae85;
  hash->s[2] = 0x3c6ef372;
  hash->s[3] = 0xa54ff53a;
  hash->s[4] = 0x510e527f;
  hash->s[5] = 0x9b05688c;
  hash->s[6] = 0x1f83d9ab;
  hash->s[7] = 0x5be0cd19;
  hash->bytes = 0;
  secp256k1_sha256_write(hash,auStack_38,0x20);
  secp256k1_sha256_write(hash,auStack_38,0x20);
  return;
}

Assistant:

static void secp256k1_sha256_initialize_tagged(secp256k1_sha256 *hash, const unsigned char *tag, size_t taglen) {
    unsigned char buf[32];
    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, tag, taglen);
    secp256k1_sha256_finalize(hash, buf);

    secp256k1_sha256_initialize(hash);
    secp256k1_sha256_write(hash, buf, 32);
    secp256k1_sha256_write(hash, buf, 32);
}